

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void loop_body(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  Scanner *scanner;
  uint32_t *puVar3;
  TokenType TVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  TokenType TVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  uint uVar15;
  Token local_50;
  
  pCVar1 = &vm->compiler;
  TVar4 = (vm->compiler).token.type;
  uVar10 = *(undefined4 *)&(vm->compiler).token.field_0x4;
  pcVar5 = (vm->compiler).token.start;
  uVar8 = (vm->compiler).token.line;
  uVar9 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
  TVar11 = (vm->compiler).next.type;
  uVar12 = *(undefined4 *)&(vm->compiler).next.field_0x4;
  pcVar6 = (vm->compiler).next.start;
  sVar7 = (vm->compiler).next.length;
  uVar13 = (vm->compiler).next.line;
  uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  (vm->compiler).previous.length = (vm->compiler).token.length;
  (vm->compiler).previous.line = uVar8;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar9;
  (vm->compiler).previous.type = TVar4;
  *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar10;
  (vm->compiler).previous.start = pcVar5;
  pTVar2 = &(vm->compiler).next;
  (vm->compiler).token.type = TVar11;
  *(undefined4 *)&(vm->compiler).token.field_0x4 = uVar12;
  (vm->compiler).token.start = pcVar6;
  (vm->compiler).token.length = sVar7;
  (vm->compiler).token.line = uVar13;
  *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
  scanner = &(vm->compiler).scanner;
  scan_token(&local_50,scanner);
  (vm->compiler).next.length = local_50.length;
  (vm->compiler).next.line = local_50.line;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
  (vm->compiler).next.type = local_50.type;
  *(undefined4 *)&(vm->compiler).next.field_0x4 = local_50._4_4_;
  (vm->compiler).next.start = local_50.start;
  uVar15 = (vm->compiler).scope_depth + 1;
  (vm->compiler).scope_depth = uVar15;
  var_ht_init((vm->compiler).scope + uVar15,8);
  while ((TVar4 = (pCVar1->token).type, TVar4 != TOKEN_CLOSE_BRACE && (TVar4 != TOKEN_EOF))) {
    stmt(vm);
  }
  uVar15 = (vm->compiler).scope_depth;
  puVar3 = &(vm->compiler).vars_in_scope;
  *puVar3 = *puVar3 - (vm->compiler).scope[uVar15].size;
  var_ht_free((vm->compiler).scope + uVar15);
  puVar3 = &(vm->compiler).scope_depth;
  *puVar3 = *puVar3 - 1;
  TVar4 = (pCVar1->token).type;
  uVar10 = *(undefined4 *)&(pCVar1->token).field_0x4;
  pcVar5 = (vm->compiler).token.start;
  uVar8 = (vm->compiler).token.line;
  uVar9 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
  (vm->compiler).previous.length = (vm->compiler).token.length;
  (vm->compiler).previous.line = uVar8;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar9;
  (vm->compiler).previous.type = TVar4;
  *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar10;
  (vm->compiler).previous.start = pcVar5;
  uVar9 = *(undefined4 *)&pTVar2->field_0x4;
  pcVar5 = (vm->compiler).next.start;
  sVar7 = (vm->compiler).next.length;
  uVar8 = (vm->compiler).next.line;
  uVar10 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  (pCVar1->token).type = pTVar2->type;
  *(undefined4 *)&(pCVar1->token).field_0x4 = uVar9;
  (vm->compiler).token.start = pcVar5;
  (vm->compiler).token.length = sVar7;
  (vm->compiler).token.line = uVar8;
  *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar10;
  scan_token(&local_50,scanner);
  (vm->compiler).next.length = local_50.length;
  (vm->compiler).next.line = local_50.line;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
  pTVar2->type = local_50.type;
  *(undefined4 *)&pTVar2->field_0x4 = local_50._4_4_;
  (vm->compiler).next.start = local_50.start;
  return;
}

Assistant:

static void loop_body(Vm *vm) {
    advance(vm);
    open_scope(vm);
    while (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
        stmt(vm);
    }
    close_scope(vm);
    advance(vm);
}